

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _all.c
# Opt level: O2

int main(int argc,char **argv)

{
  byte bVar1;
  char *__s2;
  int iVar2;
  byte bVar3;
  uchar uVar4;
  uint uVar5;
  int iVar6;
  
  GREATEST_INIT();
  iVar2 = 1;
  bVar3 = greatest_info.flags;
  uVar4 = greatest_info.verbosity;
  do {
    if (argc <= iVar2) {
LAB_0012411c:
      greatest_run_suite(CGTFS_Database,"CGTFS_Database");
      greatest_run_suite(CGTFS_DatabaseStoring,"CGTFS_DatabaseStoring");
      greatest_run_suite(CGTFS_DatabaseFetching,"CGTFS_DatabaseFetching");
      greatest_run_suite(CGTFS_DatabaseUtils,"CGTFS_DatabaseUtils");
      greatest_run_suite(CGTFS_DatabaseAgency,"CGTFS_DatabaseAgency");
      greatest_run_suite(CGTFS_DatabaseCalendarDates,"CGTFS_DatabaseCalendarDates");
      greatest_run_suite(CGTFS_DatabaseCalendarRecords,"CGTFS_DatabaseCalendarRecords");
      greatest_run_suite(CGTFS_DatabaseFareAttributes,"CGTFS_DatabaseFareAttributes");
      greatest_run_suite(CGTFS_DatabaseFareFule,"CGTFS_DatabaseFareFule");
      greatest_run_suite(CGTFS_DatabaseFeedInfo,"CGTFS_DatabaseFeedInfo");
      greatest_run_suite(CGTFS_DatabaseFrequency,"CGTFS_DatabaseFrequency");
      greatest_run_suite(CGTFS_DatabaseLevel,"CGTFS_DatabaseLevel");
      greatest_run_suite(CGTFS_DatabasePathway,"CGTFS_DatabasePathway");
      greatest_run_suite(CGTFS_DatabaseRoute,"CGTFS_DatabaseRoute");
      greatest_run_suite(CGTFS_DatabaseShape,"CGTFS_DatabaseShape");
      greatest_run_suite(CGTFS_DatabaseStopTime,"CGTFS_DatabaseStopTime");
      greatest_run_suite(CGTFS_DatabaseStop,"CGTFS_DatabaseStop");
      greatest_run_suite(CGTFS_DatabaseTransfers,"CGTFS_DatabaseTransfers");
      greatest_run_suite(CGTFS_DatabaseTrip,"CGTFS_DatabaseTrip");
      greatest_run_suite(CGTFS_EnumParsing,"CGTFS_EnumParsing");
      greatest_run_suite(CGTFS_Feed,"CGTFS_Feed");
      greatest_run_suite(CGTFS_Filenames,"CGTFS_Filenames");
      greatest_run_suite(CGTFS_Haversine,"CGTFS_Haversine");
      greatest_run_suite(CGTFS_FileUtils,"CGTFS_FileUtils");
      greatest_run_suite(CGTFS_StrUtils,"CGTFS_StrUtils");
      greatest_run_suite(CGTFS_RecordAgency,"CGTFS_RecordAgency");
      greatest_run_suite(CGTFS_RecordCalendarDate,"CGTFS_RecordCalendarDate");
      greatest_run_suite(CGTFS_RecordCalendarRecord,"CGTFS_RecordCalendarRecord");
      greatest_run_suite(CGTFS_RecordFareAttributes,"CGTFS_RecordFareAttributes");
      greatest_run_suite(CGTFS_RecordFareRule,"CGTFS_RecordFareRule");
      greatest_run_suite(CGTFS_RecordFeedInfo,"CGTFS_RecordFeedInfo");
      greatest_run_suite(CGTFS_RecordFrequency,"CGTFS_RecordFrequency");
      greatest_run_suite(CGTFS_RecordLevel,"CGTFS_RecordLevel");
      greatest_run_suite(CGTFS_RecordPathway,"CGTFS_RecordPathway");
      greatest_run_suite(CGTFS_RecordRoute,"CGTFS_RecordRoute");
      greatest_run_suite(CGTFS_RecordShape,"CGTFS_RecordShape");
      greatest_run_suite(CGTFS_RecordStopTime,"CGTFS_RecordStopTime");
      greatest_run_suite(CGTFS_RecordStop,"CGTFS_RecordStop");
      greatest_run_suite(CGTFS_RecordTransfer,"CGTFS_RecordTransfer");
      greatest_run_suite(CGTFS_RecordTrip,"CGTFS_RecordTrip");
      greatest_run_suite(CGTFS_FileReading,"CGTFS_FileReading");
      GREATEST_PRINT_REPORT();
      return (int)(greatest_info.failed != 0);
    }
    __s2 = argv[iVar2];
    iVar6 = iVar2;
    if (*__s2 == '-') {
      bVar1 = __s2[1];
      uVar5 = bVar1 - 0x73;
      if (uVar5 < 2) {
LAB_00124086:
        iVar6 = iVar2 + 1;
        if (argc <= iVar6) goto LAB_0012446f;
        if (5 < uVar5) {
switchD_001240a7_caseD_2:
          fprintf(_stdout,"Unknown argument \'%s\'\n",__s2);
LAB_0012446f:
          greatest_usage(*argv);
          exit(1);
        }
        switch(uVar5) {
        case 0:
          greatest_info.suite_filter = argv[iVar6];
          break;
        case 1:
          greatest_info.test_filter = argv[iVar6];
          break;
        default:
          goto switchD_001240a7_caseD_2;
        case 3:
switchD_001240a7_caseD_3:
          uVar4 = uVar4 + '\x01';
          iVar6 = iVar2;
          greatest_info.verbosity = uVar4;
          break;
        case 5:
          greatest_info.test_exclude = argv[iVar6];
        }
      }
      else if (bVar1 == 0x61) {
        bVar3 = bVar3 | 4;
        greatest_info.flags = bVar3;
      }
      else if (bVar1 == 0x66) {
        bVar3 = bVar3 | 1;
        greatest_info.flags = bVar3;
      }
      else {
        if (bVar1 != 0x6c) {
          if (bVar1 == 0x76) goto switchD_001240a7_caseD_3;
          if (bVar1 == 0x78) goto LAB_00124086;
          if (bVar1 != 0x2d) {
            if (bVar1 == 0x68) goto LAB_00124445;
            goto switchD_001240a7_caseD_2;
          }
          iVar2 = strncmp("--help",__s2,6);
          if (iVar2 == 0) {
LAB_00124445:
            greatest_usage(*argv);
            exit(0);
          }
          goto LAB_0012411c;
        }
        bVar3 = bVar3 | 2;
        greatest_info.flags = bVar3;
      }
    }
    iVar2 = iVar6 + 1;
  } while( true );
}

Assistant:

int main(int argc, char **argv) {
    GREATEST_MAIN_BEGIN();

    RUN_SUITE(CGTFS_Database);
    RUN_SUITE(CGTFS_DatabaseStoring);
    RUN_SUITE(CGTFS_DatabaseFetching);  // Run CGTFS_DatabaseStoring first!
    RUN_SUITE(CGTFS_DatabaseUtils);

    RUN_SUITE(CGTFS_DatabaseAgency);
    RUN_SUITE(CGTFS_DatabaseCalendarDates);
    RUN_SUITE(CGTFS_DatabaseCalendarRecords);
    RUN_SUITE(CGTFS_DatabaseFareAttributes);
    RUN_SUITE(CGTFS_DatabaseFareFule);
    RUN_SUITE(CGTFS_DatabaseFeedInfo);
    RUN_SUITE(CGTFS_DatabaseFrequency);
    RUN_SUITE(CGTFS_DatabaseLevel);
    RUN_SUITE(CGTFS_DatabasePathway);
    RUN_SUITE(CGTFS_DatabaseRoute);
    RUN_SUITE(CGTFS_DatabaseShape);
    RUN_SUITE(CGTFS_DatabaseStopTime);
    RUN_SUITE(CGTFS_DatabaseStop);
    RUN_SUITE(CGTFS_DatabaseTransfers);
    RUN_SUITE(CGTFS_DatabaseTrip);

    RUN_SUITE(CGTFS_EnumParsing);
    RUN_SUITE(CGTFS_Feed);
    RUN_SUITE(CGTFS_Filenames);
    RUN_SUITE(CGTFS_Haversine);

    RUN_SUITE(CGTFS_FileUtils);
    RUN_SUITE(CGTFS_StrUtils);

    RUN_SUITE(CGTFS_RecordAgency);
    RUN_SUITE(CGTFS_RecordCalendarDate);
    RUN_SUITE(CGTFS_RecordCalendarRecord);
    RUN_SUITE(CGTFS_RecordFareAttributes);
    RUN_SUITE(CGTFS_RecordFareRule);
    RUN_SUITE(CGTFS_RecordFeedInfo);
    RUN_SUITE(CGTFS_RecordFrequency);
    RUN_SUITE(CGTFS_RecordLevel);
    RUN_SUITE(CGTFS_RecordPathway);
    RUN_SUITE(CGTFS_RecordRoute);
    RUN_SUITE(CGTFS_RecordShape);
    RUN_SUITE(CGTFS_RecordStopTime);
    RUN_SUITE(CGTFS_RecordStop);
    RUN_SUITE(CGTFS_RecordTransfer);
    RUN_SUITE(CGTFS_RecordTrip);

    RUN_SUITE(CGTFS_FileReading);

    GREATEST_MAIN_END();
}